

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O1

int pl_l2pi(short *ll_src,int xs,int *px_dst,int npix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = (int)ll_src[2];
  if (ll_src[2] < 1) {
    iVar3 = (int)ll_src[3] + ll_src[4] * 0x8000;
    iVar2 = ll_src[1] + 1;
  }
  else {
    iVar2 = 4;
  }
  iVar1 = 0;
  if ((0 < npix) && (0 < iVar3)) {
    if (iVar2 <= iVar3) {
      uVar4 = (ulong)iVar2;
      do {
        iVar2 = (int)ll_src[uVar4 - 1];
        if (-0x1000 < iVar2) {
          iVar3 = iVar2 + 0xfff;
          if (-1 < ll_src[uVar4 - 1]) {
            iVar3 = iVar2;
          }
          iVar3 = (*(code *)(&DAT_0021af38 +
                            *(int *)(&DAT_0021af38 + (ulong)(uint)(iVar3 >> 0xc) * 4)))
                            (1,&DAT_0021af38,
                             &DAT_0021af38 +
                             *(int *)(&DAT_0021af38 + (ulong)(uint)(iVar3 >> 0xc) * 4));
          return iVar3;
        }
      } while ((1 < npix + xs) && (uVar4 = uVar4 + 1, uVar4 != iVar3 + 1));
    }
    iVar1 = npix;
    if (0 < npix) {
      memset(px_dst,0,(ulong)(npix - 1) * 4 + 4);
    }
  }
  return iVar1;
}

Assistant:

int pl_l2pi (short *ll_src, int xs, int *px_dst, int npix)
/* short *ll_src;                   encoded line list */
/* int xs;                          starting index in ll_src */
/* int *px_dst;                    output pixel array */
/* int npix;                       number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2;

    /* Local variables */
    int data, sw0001, otop, i__, lllen, i1, i2, x1, x2, ip, xe, np,
             op, pv, opcode, llfirt;
    int skipwd;

    /* Parameter adjustments */
    --px_dst;
    --ll_src;

    /* Function Body */
    if (! (ll_src[3] > 0)) {
        goto L110;
    }
    lllen = ll_src[3];
    llfirt = 4;
    goto L111;
L110:
    lllen = (ll_src[5] << 15) + ll_src[4];
    llfirt = ll_src[2] + 1;
L111:
    if (! (npix <= 0 || lllen <= 0)) {
        goto L120;
    }
    ret_val = 0;
    goto L100;
L120:
    xe = xs + npix - 1;
    skipwd = 0;
    op = 1;
    x1 = 1;
    pv = 1;
    i__1 = lllen;
    for (ip = llfirt; ip <= i__1; ++ip) {
        if (! skipwd) {
            goto L140;
        }
        skipwd = 0;
        goto L130;
L140:
        opcode = ll_src[ip] / 4096;
        data = ll_src[ip] & 4095;
        sw0001 = opcode;
        goto L150;
L160:
        x2 = x1 + data - 1;
        i1 = max(x1,xs);
        i2 = min(x2,xe);
        np = i2 - i1 + 1;
        if (! (np > 0)) {
            goto L170;
        }
        otop = op + np - 1;
        if (! (opcode == 4)) {
            goto L180;
        }
        i__2 = otop;
        for (i__ = op; i__ <= i__2; ++i__) {
            px_dst[i__] = pv;
/* L190: */
        }
/* L191: */
        goto L181;
L180:
        i__2 = otop;
        for (i__ = op; i__ <= i__2; ++i__) {
            px_dst[i__] = 0;
/* L200: */
        }
/* L201: */
        if (! (opcode == 5 && i2 == x2)) {
            goto L210;
        }
        px_dst[otop] = pv;
L210:
L181:
        op = otop + 1;
L170:
        x1 = x2 + 1;
        goto L151;
L220:
        pv = (ll_src[ip + 1] << 12) + data;
        skipwd = 1;
        goto L151;
L230:
        pv += data;
        goto L151;
L240:
        pv -= data;
        goto L151;
L250:
        pv += data;
        goto L91;
L260:
        pv -= data;
L91:
        if (! (x1 >= xs && x1 <= xe)) {
            goto L270;
        }
        px_dst[op] = pv;
        ++op;
L270:
        ++x1;
        goto L151;
L150:
        ++sw0001;
        if (sw0001 < 1 || sw0001 > 8) {
            goto L151;
        }
        switch ((int)sw0001) {
            case 1:  goto L160;
            case 2:  goto L220;
            case 3:  goto L230;
            case 4:  goto L240;
            case 5:  goto L160;
            case 6:  goto L160;
            case 7:  goto L250;
            case 8:  goto L260;
        }
L151:
        if (! (x1 > xe)) {
            goto L280;
        }
        goto L131;
L280:
L130:
        ;
    }
L131:
    i__1 = npix;
    for (i__ = op; i__ <= i__1; ++i__) {
        px_dst[i__] = 0;
/* L290: */
    }
/* L291: */
    ret_val = npix;
    goto L100;
L100:
    return ret_val;
}